

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_combined_image_sampler_abi_cxx11_
          (CompilerGLSL *this,VariableID image_id,VariableID samp_id)

{
  anon_class_8_2_24d8d211_for__M_pred __pred;
  anon_class_12_4_88f6dcbb_for__M_pred __pred_00;
  uint32_t uVar1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__cont;
  SPIRVariable *pSVar2;
  SPIRVariable *pSVar3;
  Parameter *pPVar4;
  Parameter *pPVar5;
  Parameter *pPVar6;
  CombinedImageSamplerParameter *pCVar7;
  CombinedImageSamplerParameter *pCVar8;
  CompilerError *pCVar9;
  CombinedImageSampler *__first;
  CombinedImageSampler *__last;
  Variant *pVVar10;
  Variant *pVVar11;
  uint32_t in_ECX;
  undefined4 in_register_00000034;
  Compiler *this_00;
  allocator local_1b9;
  string local_1b8 [32];
  undefined1 local_198 [48];
  CombinedImageSampler *itr_1;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> *mapping;
  string local_158 [36];
  char local_134 [4];
  undefined1 local_130 [72];
  CombinedImageSamplerParameter *itr;
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *combined;
  VariableID sid;
  VariableID iid;
  bool global_sampler;
  bool global_image;
  Parameter *sampler_itr;
  Parameter *image_itr;
  SPIRVariable *samp;
  SPIRVariable *image;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *args;
  string local_88 [32];
  __node_base_ptr local_68;
  size_type array_index;
  string array_expr;
  undefined1 local_40 [8];
  string image_expr;
  CompilerGLSL *this_local;
  VariableID samp_id_local;
  VariableID image_id_local;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,image_id.id);
  this_local._0_4_ = in_ECX;
  this_local._4_4_ = samp_id.id;
  _samp_id_local = this;
  TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  to_non_uniform_aware_expression_abi_cxx11_((CompilerGLSL *)local_40,image_id.id);
  ::std::__cxx11::string::string((string *)&array_index);
  local_68 = (__node_base_ptr)::std::__cxx11::string::find_first_of((char)local_40,0x5b);
  if (local_68 != (__node_base_ptr)0xffffffffffffffff) {
    ::std::__cxx11::string::substr((ulong)local_88,(ulong)local_40);
    ::std::__cxx11::string::operator=((string *)&array_index,local_88);
    ::std::__cxx11::string::~string(local_88);
  }
  __cont = &this_00->current_function->arguments;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  pSVar2 = Compiler::maybe_get_backing_variable(this_00,uVar1);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
  pSVar3 = Compiler::maybe_get_backing_variable(this_00,uVar1);
  if (pSVar2 != (SPIRVariable *)0x0) {
    this_local._4_4_ =
         (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar2->super_IVariant).self);
  }
  if (pSVar3 != (SPIRVariable *)0x0) {
    this_local._0_4_ = TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar3->super_IVariant).self);
  }
  pPVar4 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  pPVar5 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  pPVar4 = ::std::
           find_if<spirv_cross::SPIRFunction::Parameter*,spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>)::__0>
                     (pPVar4,pPVar5,(anon_class_4_1_b4afabfd_for__M_pred)this_local._4_4_);
  pPVar5 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  pPVar5 = ::std::
           find_if<spirv_cross::SPIRFunction::Parameter*,spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>)::__1>
                     (pPVar5,pPVar6,(anon_class_4_1_f2814289_for__M_pred)this_local._0_4_);
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  if (pPVar4 == pPVar6) {
    pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
    if (pPVar5 == pPVar6) {
      itr_1 = (CombinedImageSampler *)&this_00->combined_image_samplers;
      __first = ::std::begin<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                          ((SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)itr_1);
      __last = ::std::end<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                         ((SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)itr_1);
      local_198._32_4_ = this_local._4_4_;
      local_198._36_4_ = this_local._0_4_;
      __pred.samp_id.id = this_local._0_4_;
      __pred.image_id.id = this_local._4_4_;
      pVVar10 = (Variant *)
                ::std::
                find_if<spirv_cross::CombinedImageSampler*,spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>)::__3>
                          (__first,__last,__pred);
      local_198._40_8_ = pVVar10;
      pVVar11 = (Variant *)
                ::std::end<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                          (&this_00->combined_image_samplers);
      if (pVVar10 == pVVar11) {
        pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1b8,
                   "Cannot find mapping for combined sampler, was build_combined_image_samplers() used before compile() was called?"
                   ,&local_1b9);
        CompilerError::CompilerError(pCVar9,(string *)local_1b8);
        __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)local_198._40_8_);
      to_expression_abi_cxx11_((CompilerGLSL *)local_198,image_id.id,SUB41(uVar1,0));
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198);
      ::std::__cxx11::string::~string((string *)local_198);
      goto LAB_003660cf;
    }
  }
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  sid.id._3_1_ = pPVar4 == pPVar6;
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  sid.id._2_1_ = pPVar5 == pPVar6;
  if ((sid.id._3_1_ & 1) == 0) {
    pPVar6 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                       (__cont);
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&combined + 4),
               (int)((ulong)((long)pPVar4 - (long)pPVar6) >> 2) * -0x33333333);
  }
  else {
    combined._4_4_ = this_local._4_4_;
  }
  if ((sid.id._2_1_ & 1) == 0) {
    pPVar4 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                       (__cont);
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)&combined,
               (int)((ulong)((long)pPVar5 - (long)pPVar4) >> 2) * -0x33333333);
  }
  else {
    combined._0_4_ = this_local._0_4_;
  }
  itr = (CombinedImageSamplerParameter *)&this_00->current_function->combined_parameters;
  pCVar7 = ::std::
           begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                     ((SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *)
                      itr);
  pCVar8 = ::std::
           end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                     ((SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *)
                      itr);
  local_130[0x34] = sid.id._3_1_ & 1;
  local_130[0x35] = sid.id._2_1_ & 1;
  local_130._56_4_ = combined._4_4_;
  local_130._60_4_ = combined._0_4_;
  local_130._40_4_ = combined._0_4_;
  local_130._32_8_ =
       CONCAT44(combined._4_4_,CONCAT22(local_130._54_2_,CONCAT11(sid.id._2_1_,sid.id._3_1_))) &
       0xffffffffffff0101;
  __pred_00.sid.id = combined._0_4_;
  __pred_00._0_8_ = local_130._32_8_;
  pCVar7 = ::std::
           find_if<spirv_cross::SPIRFunction::CombinedImageSamplerParameter*,spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>)::__2>
                     (pCVar7,pCVar8,__pred_00);
  local_130._64_8_ = pCVar7;
  pCVar8 = ::std::
           end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                     ((SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *)
                      itr);
  if (pCVar7 == pCVar8) {
    mapping._6_1_ = 1;
    pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_158,
               "Cannot find mapping for combined sampler parameter, was build_combined_image_samplers() used before compile() was called?"
               ,(allocator *)((long)&mapping + 7));
    CompilerError::CompilerError(pCVar9,(string *)local_158);
    mapping._6_1_ = 0;
    __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)local_130._64_8_);
  to_expression_abi_cxx11_((CompilerGLSL *)local_130,image_id.id,SUB41(uVar1,0));
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
  ::std::__cxx11::string::~string((string *)local_130);
LAB_003660cf:
  local_134[0] = '\x01';
  local_134[1] = '\0';
  local_134[2] = '\0';
  local_134[3] = '\0';
  ::std::__cxx11::string::~string((string *)&array_index);
  ::std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

string CompilerGLSL::to_combined_image_sampler(VariableID image_id, VariableID samp_id)
{
	// Keep track of the array indices we have used to load the image.
	// We'll need to use the same array index into the combined image sampler array.
	auto image_expr = to_non_uniform_aware_expression(image_id);
	string array_expr;
	auto array_index = image_expr.find_first_of('[');
	if (array_index != string::npos)
		array_expr = image_expr.substr(array_index, string::npos);

	auto &args = current_function->arguments;

	// For GLSL and ESSL targets, we must enumerate all possible combinations for sampler2D(texture2D, sampler) and redirect
	// all possible combinations into new sampler2D uniforms.
	auto *image = maybe_get_backing_variable(image_id);
	auto *samp = maybe_get_backing_variable(samp_id);
	if (image)
		image_id = image->self;
	if (samp)
		samp_id = samp->self;

	auto image_itr = find_if(begin(args), end(args),
	                         [image_id](const SPIRFunction::Parameter &param) { return image_id == param.id; });

	auto sampler_itr = find_if(begin(args), end(args),
	                           [samp_id](const SPIRFunction::Parameter &param) { return samp_id == param.id; });

	if (image_itr != end(args) || sampler_itr != end(args))
	{
		// If any parameter originates from a parameter, we will find it in our argument list.
		bool global_image = image_itr == end(args);
		bool global_sampler = sampler_itr == end(args);
		VariableID iid = global_image ? image_id : VariableID(uint32_t(image_itr - begin(args)));
		VariableID sid = global_sampler ? samp_id : VariableID(uint32_t(sampler_itr - begin(args)));

		auto &combined = current_function->combined_parameters;
		auto itr = find_if(begin(combined), end(combined), [=](const SPIRFunction::CombinedImageSamplerParameter &p) {
			return p.global_image == global_image && p.global_sampler == global_sampler && p.image_id == iid &&
			       p.sampler_id == sid;
		});

		if (itr != end(combined))
			return to_expression(itr->id) + array_expr;
		else
		{
			SPIRV_CROSS_THROW("Cannot find mapping for combined sampler parameter, was "
			                  "build_combined_image_samplers() used "
			                  "before compile() was called?");
		}
	}
	else
	{
		// For global sampler2D, look directly at the global remapping table.
		auto &mapping = combined_image_samplers;
		auto itr = find_if(begin(mapping), end(mapping), [image_id, samp_id](const CombinedImageSampler &combined) {
			return combined.image_id == image_id && combined.sampler_id == samp_id;
		});

		if (itr != end(combined_image_samplers))
			return to_expression(itr->combined_id) + array_expr;
		else
		{
			SPIRV_CROSS_THROW("Cannot find mapping for combined sampler, was build_combined_image_samplers() used "
			                  "before compile() was called?");
		}
	}
}